

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderSwitchTests.cpp
# Opt level: O0

void deqp::evalSwitchUniform(ShaderEvalContext *evalCtx)

{
  VecAccess<float,_4,_3> local_38;
  undefined1 local_1c [20];
  ShaderEvalContext *evalCtx_local;
  
  local_1c._12_8_ = evalCtx;
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_1c,(int)evalCtx,1,2);
  tcu::Vector<float,_4>::xyz(&local_38,(Vec4 *)(local_1c._12_8_ + 0x1f0));
  tcu::VecAccess<float,_4,_3>::operator=(&local_38,(Vector<float,_3> *)local_1c);
  return;
}

Assistant:

static void evalSwitchUniform(ShaderEvalContext& evalCtx)
{
	evalCtx.color.xyz() = evalCtx.coords.swizzle(1, 2, 3);
}